

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.cpp
# Opt level: O1

void de::BlockBufferBasicTest::runTest(void)

{
  int j;
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  Consumer *pCVar5;
  ulong uVar6;
  size_t __n;
  int iVar7;
  uint numProducers;
  long *plVar8;
  long *plVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
  consumers;
  vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
  producers;
  Message endMsg;
  Random rnd;
  MessageBuffer buffer;
  long *local_d8;
  long *plStack_d0;
  long local_c8;
  long *local_b8;
  long *plStack_b0;
  long local_a8;
  Consumer *local_a0;
  deUint32 local_94;
  deRandom local_90;
  BlockBuffer<de::BlockBufferBasicTest::Message> local_80;
  
  local_94 = 0;
  do {
    deRandom_init(&local_90,local_94);
    dVar1 = deRandom_getUint32(&local_90);
    dVar2 = deRandom_getUint32(&local_90);
    dVar3 = deRandom_getUint32(&local_90);
    numProducers = (dVar3 & 0xf) + 1;
    dVar3 = deRandom_getUint32(&local_90);
    dVar4 = deRandom_getUint32(&local_90);
    __n = (size_t)((dVar4 / 0x97) * -0x97);
    uVar14 = dVar4 % 0x97 + 0x32;
    BlockBuffer<de::BlockBufferBasicTest::Message>::BlockBuffer
              (&local_80,(dVar2 & 0xf) + 1,dVar1 % 0x7f + 2);
    local_a8 = 0;
    local_b8 = (long *)0x0;
    plStack_b0 = (long *)0x0;
    local_c8 = 0;
    local_d8 = (long *)0x0;
    plStack_d0 = (long *)0x0;
    uVar11 = 0;
    do {
      pCVar5 = (Consumer *)operator_new(0x28);
      Thread::Thread((Thread *)pCVar5);
      (pCVar5->super_Thread)._vptr_Thread = (_func_int **)&PTR__Thread_00277b10;
      pCVar5->m_buffer = &local_80;
      *(short *)&(pCVar5->m_lastPayload).
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start = (short)uVar11;
      *(uint *)((long)&(pCVar5->m_lastPayload).
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start + 4) = uVar14;
      local_a0 = pCVar5;
      std::
      vector<de::BlockBufferBasicTest::Producer*,std::allocator<de::BlockBufferBasicTest::Producer*>>
      ::emplace_back<de::BlockBufferBasicTest::Producer*>
                ((vector<de::BlockBufferBasicTest::Producer*,std::allocator<de::BlockBufferBasicTest::Producer*>>
                  *)&local_b8,(Producer **)&local_a0);
      uVar11 = uVar11 + 1;
    } while (numProducers != uVar11);
    uVar12 = (dVar3 & 0xf) + 1;
    uVar11 = uVar12;
    do {
      pCVar5 = (Consumer *)operator_new(0x50);
      Consumer::Consumer(pCVar5,&local_80,numProducers);
      local_a0 = pCVar5;
      std::
      vector<de::BlockBufferBasicTest::Consumer*,std::allocator<de::BlockBufferBasicTest::Consumer*>>
      ::emplace_back<de::BlockBufferBasicTest::Consumer*>
                ((vector<de::BlockBufferBasicTest::Consumer*,std::allocator<de::BlockBufferBasicTest::Consumer*>>
                  *)&local_d8,&local_a0);
      uVar11 = uVar11 - 1;
      plVar8 = local_d8;
    } while (uVar11 != 0);
    for (; plVar9 = local_b8, plVar8 != plStack_d0; plVar8 = plVar8 + 1) {
      Thread::start((Thread *)*plVar8);
    }
    for (; plVar8 = local_b8, plVar9 != plStack_b0; plVar9 = plVar9 + 1) {
      Thread::start((Thread *)*plVar9);
    }
    for (; plVar8 != plStack_b0; plVar8 = plVar8 + 1) {
      Thread::join((Thread *)*plVar8);
    }
    local_a0 = (Consumer *)CONCAT44(local_a0._4_4_,0xffff0000);
    uVar11 = uVar12;
    do {
      BlockBuffer<de::BlockBufferBasicTest::Message>::write(&local_80,1,&local_a0,__n);
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
    BlockBuffer<de::BlockBufferBasicTest::Message>::flush(&local_80);
    for (plVar8 = local_d8; plVar8 != plStack_d0; plVar8 = plVar8 + 1) {
      Thread::join((Thread *)*plVar8);
    }
    if (uVar14 < 2) {
      uVar14 = 1;
    }
    uVar11 = 0;
    iVar10 = 0;
    do {
      iVar10 = iVar10 + (uVar11 & 0xffff);
      uVar11 = uVar11 + 1;
    } while (uVar14 != uVar11);
    uVar13 = 0;
    do {
      uVar6 = 0;
      iVar7 = 0;
      do {
        iVar7 = iVar7 + *(int *)(*(long *)(local_d8[uVar6] + 0x38) + uVar13 * 4);
        uVar6 = uVar6 + 1;
      } while (uVar12 != uVar6);
      if (iVar10 != iVar7) {
        deAssertFail("refSum == cmpSum",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deBlockBuffer.cpp"
                     ,0xd4);
      }
      uVar13 = uVar13 + 1;
      plVar8 = local_b8;
    } while (uVar13 != numProducers);
    for (; plVar9 = local_d8, plVar8 != plStack_b0; plVar8 = plVar8 + 1) {
      if ((long *)*plVar8 != (long *)0x0) {
        (**(code **)(*(long *)*plVar8 + 8))();
      }
    }
    for (; plVar9 != plStack_d0; plVar9 = plVar9 + 1) {
      if ((long *)*plVar9 != (long *)0x0) {
        (**(code **)(*(long *)*plVar9 + 8))();
      }
    }
    if (local_d8 != (long *)0x0) {
      operator_delete(local_d8,local_c8 - (long)local_d8);
    }
    if (local_b8 != (long *)0x0) {
      operator_delete(local_b8,local_a8 - (long)local_b8);
    }
    BlockBuffer<de::BlockBufferBasicTest::Message>::~BlockBuffer(&local_80);
    local_94 = local_94 + 1;
  } while (local_94 != 8);
  return;
}

Assistant:

void runTest (void)
{
	const int numIterations = 8;
	for (int iterNdx = 0; iterNdx < numIterations; iterNdx++)
	{
		Random							rnd				(iterNdx);
		int								numBlocks		= rnd.getInt(2, 128);
		int								blockSize		= rnd.getInt(1, 16);
		int								numProducers	= rnd.getInt(1, 16);
		int								numConsumers	= rnd.getInt(1, 16);
		int								dataSize		= rnd.getInt(50, 200);
		MessageBuffer					buffer			(blockSize, numBlocks);
		vector<Producer*>				producers;
		vector<Consumer*>				consumers;

		for (int i = 0; i < numProducers; i++)
			producers.push_back(new Producer(buffer, (deUint16)i, dataSize));

		for (int i = 0; i < numConsumers; i++)
			consumers.push_back(new Consumer(buffer, numProducers));

		// Start consumers.
		for (vector<Consumer*>::iterator i = consumers.begin(); i != consumers.end(); i++)
			(*i)->start();

		// Start producers.
		for (vector<Producer*>::iterator i = producers.begin(); i != producers.end(); i++)
			(*i)->start();

		// Wait for producers.
		for (vector<Producer*>::iterator i = producers.begin(); i != producers.end(); i++)
			(*i)->join();

		// Write end messages for consumers.
		const Message endMsg(0xffff, 0);
		for (int i = 0; i < numConsumers; i++)
			buffer.write(1, &endMsg);
		buffer.flush();

		// Wait for consumers.
		for (vector<Consumer*>::iterator i = consumers.begin(); i != consumers.end(); i++)
			(*i)->join();

		// Verify payload sums.
		deUint32 refSum = 0;
		for (int i = 0; i < dataSize; i++)
			refSum += (deUint32)(deUint16)i;

		for (int i = 0; i < numProducers; i++)
		{
			deUint32 cmpSum = 0;
			for (int j = 0; j < numConsumers; j++)
				cmpSum += consumers[j]->getPayloadSum((deUint16)i);
			DE_TEST_ASSERT(refSum == cmpSum);
		}

		// Free resources.
		for (vector<Producer*>::iterator i = producers.begin(); i != producers.end(); i++)
			delete *i;
		for (vector<Consumer*>::iterator i = consumers.begin(); i != consumers.end(); i++)
			delete *i;
	}
}